

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vector.h
# Opt level: O0

void __thiscall vector<Edge>::push_back(vector<Edge> *this,Edge *info)

{
  size_t in_RDX;
  Edge *info_local;
  vector<Edge> *this_local;
  
  if (this->_capacity < this->_size + 1) {
    realloc(this,(void *)(ulong)(uint)(this->_capacity << 1),in_RDX);
  }
  this->_size = this->_size + 1;
  Edge::operator=(this->vect + (this->_size + -1),info);
  return;
}

Assistant:

inline void push_back(const T &info) {
        if (_size + 1 > _capacity) {
            realloc(_capacity * 2);
        }

        ++_size;
        vect[_size - 1] = info;
    }